

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_loop_expand.cpp
# Opt level: O1

bool __thiscall optimization::loop_expand::loop_info::operator<(loop_info *this,loop_info *other)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  Tag *tag;
  bool bVar4;
  ostream local_111;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  undefined **local_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  undefined1 local_a8;
  Function local_a0;
  undefined **local_48;
  undefined8 local_40;
  undefined1 local_38;
  
  switch(this->in_op) {
  case Gt:
    bVar4 = other->in_value < (this->init_var).second;
    break;
  case Lt:
    bVar4 = (this->init_var).second < other->in_value;
    break;
  case Gte:
    bVar4 = other->in_value <= (this->init_var).second;
    break;
  case Lte:
    bVar4 = (this->init_var).second <= other->in_value;
    break;
  case Eq:
    bVar4 = (this->init_var).second == other->in_value;
    break;
  case Neq:
    bVar4 = (this->init_var).second != other->in_value;
    break;
  default:
    local_111 = (ostream)0x5;
    AixLog::operator<<(&local_111,(Severity *)other);
    local_d0 = &PTR__Tag_001edee0;
    local_c0 = 0;
    local_b8 = 0;
    local_a8 = 1;
    local_c8 = &local_b8;
    AixLog::operator<<((ostream *)&local_d0,(Tag *)other);
    local_40 = std::chrono::_V2::system_clock::now();
    local_48 = &PTR__Timestamp_001edeb0;
    local_38 = 0;
    AixLog::operator<<((ostream *)&local_48,(Timestamp *)other);
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"operator<","");
    pcVar3 = 
    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/const_loop_expand.cpp"
    ;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/const_loop_expand.cpp"
               ,"");
    paVar1 = &local_a0.name.field_2;
    local_a0._vptr_Function = (_func_int **)&PTR__Function_001edf10;
    if (local_f0 == &local_e0) {
      local_a0.name.field_2._8_8_ = local_e0._8_8_;
      local_a0.name._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_a0.name._M_dataplus._M_p = (pointer)local_f0;
    }
    paVar2 = &local_a0.file.field_2;
    local_a0.name._M_string_length = local_e8;
    local_e8 = 0;
    local_e0._M_local_buf[0] = '\0';
    if (local_110 == &local_100) {
      local_a0.file.field_2._8_8_ = local_100._8_8_;
      local_a0.file._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_a0.file._M_dataplus._M_p = (pointer)local_110;
    }
    local_a0.file._M_string_length = local_108;
    local_108 = 0;
    local_100._M_local_buf[0] = '\0';
    local_a0.line = 0x86;
    local_a0.is_null_ = false;
    local_110 = &local_100;
    local_f0 = &local_e0;
    AixLog::operator<<((ostream *)&local_a0,(Function *)pcVar3);
    pcVar3 = "ERROR ! Unrecognized in_op";
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"ERROR ! Unrecognized in_op",0x1a);
    AixLog::Function::~Function(&local_a0);
    if (local_110 != &local_100) {
      pcVar3 = (char *)(CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]) +
                       1);
      operator_delete(local_110,(ulong)pcVar3);
    }
    if (local_f0 != &local_e0) {
      pcVar3 = (char *)(CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]) + 1)
      ;
      operator_delete(local_f0,(ulong)pcVar3);
    }
    local_d0 = &PTR__Tag_001edee0;
    if (local_c8 != &local_b8) {
      pcVar3 = (char *)(CONCAT71(uStack_b7,local_b8) + 1);
      operator_delete(local_c8,(ulong)pcVar3);
    }
    local_111 = (ostream)0x5;
    AixLog::operator<<(&local_111,(Severity *)pcVar3);
    local_d0 = &PTR__Tag_001edee0;
    local_c0 = 0;
    local_b8 = 0;
    local_a8 = 1;
    local_c8 = &local_b8;
    AixLog::operator<<((ostream *)&local_d0,(Tag *)pcVar3);
    local_40 = std::chrono::_V2::system_clock::now();
    local_48 = &PTR__Timestamp_001edeb0;
    local_38 = 0;
    AixLog::operator<<((ostream *)&local_48,(Timestamp *)pcVar3);
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"operator<","");
    pcVar3 = 
    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/const_loop_expand.cpp"
    ;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/const_loop_expand.cpp"
               ,"");
    local_a0._vptr_Function = (_func_int **)&PTR__Function_001edf10;
    if (local_f0 == &local_e0) {
      local_a0.name.field_2._8_8_ = local_e0._8_8_;
      local_a0.name._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_a0.name._M_dataplus._M_p = (pointer)local_f0;
    }
    local_a0.name.field_2._M_allocated_capacity._1_7_ = local_e0._M_allocated_capacity._1_7_;
    local_a0.name.field_2._M_local_buf[0] = local_e0._M_local_buf[0];
    local_a0.name._M_string_length = local_e8;
    local_e8 = 0;
    local_e0._M_local_buf[0] = '\0';
    if (local_110 == &local_100) {
      local_a0.file.field_2._8_8_ = local_100._8_8_;
      local_a0.file._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_a0.file._M_dataplus._M_p = (pointer)local_110;
    }
    local_a0.file.field_2._M_allocated_capacity._1_7_ = local_100._M_allocated_capacity._1_7_;
    local_a0.file.field_2._M_local_buf[0] = local_100._M_local_buf[0];
    local_a0.file._M_string_length = local_108;
    local_108 = 0;
    local_100._M_local_buf[0] = '\0';
    local_a0.line = 0x87;
    local_a0.is_null_ = false;
    local_110 = &local_100;
    local_f0 = &local_e0;
    AixLog::operator<<((ostream *)&local_a0,(Function *)pcVar3);
    tag = (Tag *)(ulong)this->in_op;
    mir::inst::display_op((ostream *)&std::clog,this->in_op);
    AixLog::Function::~Function(&local_a0);
    if (local_110 != &local_100) {
      tag = (Tag *)(CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]) + 1);
      operator_delete(local_110,(ulong)tag);
    }
    if (local_f0 != &local_e0) {
      tag = (Tag *)(CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]) + 1);
      operator_delete(local_f0,(ulong)tag);
    }
    local_d0 = &PTR__Tag_001edee0;
    if (local_c8 != &local_b8) {
      tag = (Tag *)(CONCAT71(uStack_b7,local_b8) + 1);
      operator_delete(local_c8,(ulong)tag);
    }
    local_111 = (ostream)0x5;
    AixLog::operator<<(&local_111,(Severity *)tag);
    local_d0 = &PTR__Tag_001edee0;
    local_c0 = 0;
    local_b8 = 0;
    local_a8 = 1;
    local_c8 = &local_b8;
    AixLog::operator<<((ostream *)&local_d0,tag);
    local_40 = std::chrono::_V2::system_clock::now();
    local_48 = &PTR__Timestamp_001edeb0;
    local_38 = 0;
    AixLog::operator<<((ostream *)&local_48,(Timestamp *)tag);
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"operator<","");
    pcVar3 = 
    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/const_loop_expand.cpp"
    ;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/const_loop_expand.cpp"
               ,"");
    local_a0._vptr_Function = (_func_int **)&PTR__Function_001edf10;
    if (local_f0 == &local_e0) {
      local_a0.name.field_2._8_8_ = local_e0._8_8_;
      local_a0.name._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_a0.name._M_dataplus._M_p = (pointer)local_f0;
    }
    local_a0.name.field_2._M_allocated_capacity._1_7_ = local_e0._M_allocated_capacity._1_7_;
    local_a0.name.field_2._M_local_buf[0] = local_e0._M_local_buf[0];
    local_a0.name._M_string_length = local_e8;
    local_e8 = 0;
    local_e0._M_local_buf[0] = '\0';
    if (local_110 == &local_100) {
      local_a0.file.field_2._8_8_ = local_100._8_8_;
      local_a0.file._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_a0.file._M_dataplus._M_p = (pointer)local_110;
    }
    local_a0.file.field_2._M_allocated_capacity._1_7_ = local_100._M_allocated_capacity._1_7_;
    local_a0.file.field_2._M_local_buf[0] = local_100._M_local_buf[0];
    local_a0.file._M_string_length = local_108;
    local_108 = 0;
    local_100._M_local_buf[0] = '\0';
    local_a0.line = 0x88;
    local_a0.is_null_ = false;
    local_110 = &local_100;
    local_f0 = &local_e0;
    AixLog::operator<<((ostream *)&local_a0,(Function *)pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog," ! ",3);
    std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    AixLog::Function::~Function(&local_a0);
    if (local_110 != &local_100) {
      operator_delete(local_110,
                      CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]) + 1)
      ;
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,CONCAT71(local_e0._M_allocated_capacity._1_7_,
                                        local_e0._M_local_buf[0]) + 1);
    }
    local_d0 = &PTR__Tag_001edee0;
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool operator<(const loop_info& other) const {
    switch (in_op) {
      case mir::inst::Op::Eq:
        return init_var.second == other.in_value;
      case mir::inst::Op::Neq:
        return init_var.second != other.in_value;
      case mir::inst::Op::Lt:
        return init_var.second < other.in_value;
      case mir::inst::Op::Lte:
        return init_var.second <= other.in_value;
      case mir::inst::Op::Gt:
        return init_var.second > other.in_value;
      case mir::inst::Op::Gte:
        return init_var.second >= other.in_value;
      default: {
        LOG(ERROR) << "ERROR ! Unrecognized in_op";
        mir::inst::display_op(LOG(ERROR), in_op);
        LOG(ERROR) << " ! " << std::endl;
        return false;
      }
    }
  }